

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateRequiredCMakeVersion
          (cmExportFileGenerator *this,ostream *os,char *versionString)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"if(CMAKE_VERSION VERSION_LESS ");
  poVar1 = std::operator<<(poVar1,versionString);
  poVar1 = std::operator<<(poVar1,
                           ")\n  message(FATAL_ERROR \"This file relies on consumers using CMake ");
  poVar1 = std::operator<<(poVar1,versionString);
  std::operator<<(poVar1," or greater.\")\nendif()\n\n");
  return;
}

Assistant:

void cmExportFileGenerator::GenerateRequiredCMakeVersion(
  std::ostream& os, const char* versionString)
{
  /* clang-format off */
  os << "if(CMAKE_VERSION VERSION_LESS " << versionString << ")\n"
        "  message(FATAL_ERROR \"This file relies on consumers using "
        "CMake " << versionString << " or greater.\")\n"
        "endif()\n\n";
  /* clang-format on */
}